

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsPosixTestProcess.cpp
# Opt level: O0

void __thiscall xs::PosixTestProcess::PosixTestProcess(PosixTestProcess *this)

{
  PosixTestProcess *this_local;
  
  TestProcess::TestProcess(&this->super_TestProcess);
  (this->super_TestProcess)._vptr_TestProcess = (_func_int **)&PTR__PosixTestProcess_0015f5b0;
  this->m_process = (Process *)0x0;
  this->m_processStartTime = 0;
  std::__cxx11::string::string((string *)&this->m_logFileName);
  de::BlockBuffer<unsigned_char>::BlockBuffer(&this->m_infoBuffer,0x40,0x80);
  posix::CaseListWriter::CaseListWriter(&this->m_caseListWriter);
  posix::PipeReader::PipeReader(&this->m_stdOutReader,&this->m_infoBuffer);
  posix::PipeReader::PipeReader(&this->m_stdErrReader,&this->m_infoBuffer);
  posix::FileReader::FileReader(&this->m_logReader,0x400,0x200);
  return;
}

Assistant:

PosixTestProcess::PosixTestProcess (void)
	: m_process				(DE_NULL)
	, m_processStartTime	(0)
	, m_infoBuffer			(INFO_BUFFER_BLOCK_SIZE, INFO_BUFFER_NUM_BLOCKS)
	, m_stdOutReader		(&m_infoBuffer)
	, m_stdErrReader		(&m_infoBuffer)
	, m_logReader			(LOG_BUFFER_BLOCK_SIZE, LOG_BUFFER_NUM_BLOCKS)
{
}